

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTestPackages.cpp
# Opt level: O0

void __thiscall gl3cts::TestCaseWrapper::deinit(TestCaseWrapper *this,TestCase *testCase)

{
  Context *this_00;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  Context *context;
  TestCase *testCase_local;
  TestCaseWrapper *this_local;
  
  (*(testCase->super_TestNode)._vptr_TestNode[3])();
  this_00 = deqp::TestPackage::getContext(&this->m_testPackage->super_TestPackage);
  renderCtx = deqp::Context::getRenderContext(this_00);
  ctxInfo = deqp::Context::getContextInfo(this_00);
  glu::resetState(renderCtx,ctxInfo);
  return;
}

Assistant:

void TestCaseWrapper::deinit(tcu::TestCase* testCase)
{
	testCase->deinit();

	deqp::Context& context = m_testPackage.getContext();
	glu::resetState(context.getRenderContext(), context.getContextInfo());
}